

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fields.c
# Opt level: O2

void initUVP(double ***U,double ***V,double ***P,int imax,int jmax,double *init)

{
  int sizeY;
  int sizeX;
  double **ppdVar1;
  
  if (P != (double ***)0x0 && (V != (double ***)0x0 && U != (double ***)0x0)) {
    sizeX = imax + 2;
    sizeY = jmax + 2;
    ppdVar1 = create2Dfield(sizeX,sizeY);
    *P = ppdVar1;
    ppdVar1 = create2Dfield(imax + 3,sizeY);
    *U = ppdVar1;
    ppdVar1 = create2Dfield(sizeX,jmax + 3);
    *V = ppdVar1;
    if (init != (double *)0x0) {
      fill2Dfield(init[2],*P,sizeX,sizeY);
      fill2Dfield(*init,*U,imax + 3,sizeY);
      fill2Dfield(init[1],*V,sizeX,jmax + 3);
      return;
    }
  }
  return;
}

Assistant:

void initUVP (REAL ***U, REAL ***V, REAL ***P, int imax, int jmax, REAL *init)
{
	if (!U || !V || !P)
		return;
	*P = create2Dfield(imax+2,jmax+2);
	*U = create2Dfield(imax+3,jmax+2);
	*V = create2Dfield(imax+2,jmax+3);
	if (!init)
		return;
	fill2Dfield(init[2],*P,imax+2,jmax+2);
	fill2Dfield(init[0],*U,imax+3,jmax+2);
	fill2Dfield(init[1],*V,imax+2,jmax+3);
	return;
}